

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcComplexProperty::IfcComplexProperty(IfcComplexProperty *this)

{
  *(undefined ***)&this->field_0xa0 = &PTR__Object_007631c0;
  *(undefined8 *)&this->field_0xa8 = 0;
  *(char **)&this->field_0xb0 = "IfcComplexProperty";
  IfcProperty::IfcProperty(&this->super_IfcProperty,&PTR_construction_vtable_24__007fb450);
  *(undefined8 *)&(this->super_IfcProperty).field_0x60 = 0;
  (this->super_IfcProperty).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>.
  _vptr_ObjectHelper = (_func_int **)0x7fb3e8;
  *(undefined8 *)&this->field_0xa0 = 0x7fb438;
  *(undefined8 *)&(this->super_IfcProperty).field_0x58 = 0x7fb410;
  *(undefined1 **)&(this->super_IfcProperty).field_0x68 = &this->field_0x78;
  *(undefined8 *)&this->field_0x70 = 0;
  this->field_0x78 = 0;
  (this->HasProperties).
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->HasProperties).
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->HasProperties).
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

IfcComplexProperty() : Object("IfcComplexProperty") {}